

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void pobr::utils::Logger::print(uint *labelShift,string *message)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [8];
  string line;
  stringstream local_1a0 [8];
  stringstream messageStream;
  ostream local_190 [376];
  string *local_18;
  string *message_local;
  uint *labelShift_local;
  
  local_18 = message;
  message_local = (string *)labelShift;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,(string *)local_18);
  std::__cxx11::string::string(local_1d0);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_1a0,local_1d0);
  poVar3 = std::operator<<((ostream *)&std::cout,local_1d0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a0,local_1d0);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar2) break;
    uVar1 = *(uint *)message_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,(ulong)uVar1,' ',&local_1f1);
    poVar3 = std::operator<<((ostream *)&std::cout,local_1f0);
    poVar3 = std::operator<<(poVar3,local_1d0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  }
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void Logger::print(const unsigned int& labelShift, const std::string& message)
{
    std::stringstream messageStream;
    messageStream << message;

    std::string line;

    std::getline(messageStream, line);
    std::cout << line << std::endl;

    while (std::getline(messageStream, line))
    {
        std::cout << std::string(labelShift, ' ') << line << std::endl;
    }
}